

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CNewIdentifier *exp)

{
  CIdExp *pCVar1;
  iterator iVar2;
  CError *this_00;
  string errorMessage;
  CError CStack_68;
  string local_38;
  
  this_00 = &CStack_68;
  std::operator<<((ostream *)&std::cout,"typechecker: CNewIdentifier\n");
  pCVar1 = (exp->identifier)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar1 == (CIdExp *)0x0) {
    CError::CError(&CStack_68,&CError::AST_ERROR_abi_cxx11_,
                   &(exp->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>(&this->errors,&CStack_68);
  }
  else {
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,&pCVar1->name);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      CError::GetUndeclaredErrorMessage
                (&local_38,
                 &((exp->identifier)._M_t.
                   super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                   super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                   super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name);
      CError::CError(&CStack_68,&local_38,&(exp->super_IExpression).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>(&this->errors,&CStack_68);
      std::__cxx11::string::~string((string *)&CStack_68);
      this_00 = (CError *)&local_38;
    }
    else {
      TypeInfo::TypeInfo((TypeInfo *)&CStack_68,
                         &((exp->identifier)._M_t.
                           super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name);
      TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)&CStack_68);
      this_00 = (CError *)&CStack_68.message._M_string_length;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CNewIdentifier &exp ) 
{
    std::cout << "typechecker: CNewIdentifier\n";

    if( exp.identifier ) {
        if( table->classes.find(exp.identifier->name) == table->classes.end() ) {
            auto errorMessage = CError::GetUndeclaredErrorMessage( exp.identifier->name );
            errors.push_back( CError( errorMessage, exp.position) );
            return;
        }
        lastCalculatedType = exp.identifier->name;
    } else {
        errors.push_back( CError( CError::AST_ERROR, exp.position ) );
    }
}